

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O3

bool __thiscall ghc::filesystem::path::has_relative_path(path *this)

{
  char *pcVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar5 = (this->_path)._M_string_length;
  if (uVar5 < 3) {
    uVar3 = 0;
LAB_00107bd2:
    uVar4 = 0;
LAB_00107bd4:
    if (uVar4 < uVar5) {
      uVar4 = (ulong)((this->_path)._M_dataplus._M_p[uVar4] == '/');
      goto LAB_00107c34;
    }
  }
  else {
    pcVar1 = (this->_path)._M_dataplus._M_p;
    if ((((*pcVar1 == '/') && (pcVar1[1] == '/')) && (pcVar1[2] != 0x2f)) &&
       (iVar2 = isprint((int)pcVar1[2]), iVar2 != 0)) {
      uVar3 = std::__cxx11::string::find((char)this,0x2f);
      uVar5 = (this->_path)._M_string_length;
      if (uVar3 == 0xffffffffffffffff) {
        uVar3 = uVar5;
      }
      if (uVar5 < 3) goto LAB_00107bd2;
    }
    else {
      uVar3 = 0;
    }
    pcVar1 = (this->_path)._M_dataplus._M_p;
    if (*pcVar1 == '/') {
      uVar4 = 1;
      if (((pcVar1[1] != '/') || (pcVar1[2] == 0x2f)) ||
         (iVar2 = isprint((int)pcVar1[2]), iVar2 == 0)) goto LAB_00107c34;
      uVar4 = std::__cxx11::string::find((char)this,0x2f);
      uVar5 = (this->_path)._M_string_length;
      if (uVar4 == 0xffffffffffffffff) {
        uVar4 = uVar5;
      }
      goto LAB_00107bd4;
    }
  }
  uVar4 = 0;
LAB_00107c34:
  return uVar3 + uVar4 < uVar5;
}

Assistant:

GHC_INLINE bool path::has_relative_path() const
{
    auto rootPathLen = _prefixLength + root_name_length() + (has_root_directory() ? 1 : 0);
    return rootPathLen < _path.length();
}